

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_psubb_mips64el(uint64_t fs,uint64_t ft)

{
  return CONCAT17((char)(fs >> 0x38) - (char)(ft >> 0x38),
                  CONCAT16((char)(fs >> 0x30) - (char)(ft >> 0x30),
                           CONCAT15((char)(fs >> 0x28) - (char)(ft >> 0x28),
                                    CONCAT14((char)(fs >> 0x20) - (char)(ft >> 0x20),
                                             CONCAT13((char)(fs >> 0x18) - (char)(ft >> 0x18),
                                                      CONCAT12((char)(fs >> 0x10) -
                                                               (char)(ft >> 0x10),
                                                               CONCAT11((char)(fs >> 8) -
                                                                        (char)(ft >> 8),
                                                                        (char)fs - (char)ft)))))));
}

Assistant:

uint64_t helper_psubb(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 8; ++i) {
        vs.ub[i] -= vt.ub[i];
    }
    return vs.d;
}